

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

void __thiscall
helics::NetworkCommsInterface::setFlag(NetworkCommsInterface *this,string_view flag,bool val)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  __y._M_str = "os_port";
  __y._M_len = 7;
  bVar1 = std::operator==(flag,__y);
  if (bVar1) {
    bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
    if (!bVar1) {
      return;
    }
    this->useOsPortAllocation = val;
  }
  else {
    __y_00._M_str = "noack_connect";
    __y_00._M_len = 0xd;
    bVar1 = std::operator==(flag,__y_00);
    if (!bVar1) {
      CommsInterface::setFlag(&this->super_CommsInterface,flag,val);
      return;
    }
    bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
    if (!bVar1) {
      return;
    }
    this->noAckConnection = val;
  }
  CommsInterface::propertyUnLock(&this->super_CommsInterface);
  return;
}

Assistant:

void NetworkCommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "os_port") {
        if (propertyLock()) {
            useOsPortAllocation = val;
            propertyUnLock();
        }
    } else if (flag == "noack_connect") {
        if (propertyLock()) {
            noAckConnection = val;
            propertyUnLock();
        }
    } else {
        CommsInterface::setFlag(flag, val);
    }
}